

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qradiobutton.cpp
# Opt level: O1

void __thiscall QRadioButton::initStyleOption(QRadioButton *this,QStyleOptionButton *option)

{
  State *pSVar1;
  long lVar2;
  bool bVar3;
  QSize QVar4;
  uint uVar5;
  
  if (option != (QStyleOptionButton *)0x0) {
    lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
    QStyleOption::initFrom(&option->super_QStyleOption,(QWidget *)this);
    QString::operator=(&option->text,(QString *)(lVar2 + 600));
    QIcon::operator=(&option->icon,(QIcon *)(lVar2 + 0x270));
    QVar4 = QAbstractButton::iconSize(&this->super_QAbstractButton);
    option->iconSize = QVar4;
    if ((*(byte *)(lVar2 + 0x28c) & 0x10) != 0) {
      pSVar1 = &(option->super_QStyleOption).state;
      *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                super_QFlagsStorage<QStyle::StateFlag>.i =
           (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                 super_QFlagsStorage<QStyle::StateFlag>.i | 4;
    }
    uVar5 = 0x20;
    if ((*(byte *)(lVar2 + 0x28c) & 2) == 0) {
      uVar5 = 8;
    }
    pSVar1 = &(option->super_QStyleOption).state;
    (pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).super_QFlagsStorage<QStyle::StateFlag>
    .i = (pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
         super_QFlagsStorage<QStyle::StateFlag>.i | uVar5;
    bVar3 = QWidget::testAttribute_helper((QWidget *)this,WA_Hover);
    if ((bVar3) &&
       ((((this->super_QAbstractButton).super_QWidget.data)->widget_attributes & 2) != 0)) {
      (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (*(byte *)(lVar2 + 0x2b4) & 1) << 0xd |
           (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i & 0xffffdfff;
    }
  }
  return;
}

Assistant:

void QRadioButton::initStyleOption(QStyleOptionButton *option) const
{
    if (!option)
        return;
    Q_D(const QRadioButton);
    option->initFrom(this);
    option->text = d->text;
    option->icon = d->icon;
    option->iconSize = iconSize();
    if (d->down)
        option->state |= QStyle::State_Sunken;
    option->state |= (d->checked) ? QStyle::State_On : QStyle::State_Off;
    if (testAttribute(Qt::WA_Hover) && underMouse()) {
        option->state.setFlag(QStyle::State_MouseOver, d->hovering);
    }
}